

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

int Abc_NtkAppend(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fAddPos)

{
  uint uVar1;
  uint uVar2;
  Abc_Aig_t *pMan;
  Nm_Man_t *p;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  int iNodeId;
  int fCompl;
  Abc_Obj_t *pDriverNew;
  Abc_Obj_t *pDriverOld;
  Abc_Obj_t *pObjOld;
  int nNewCis;
  int i;
  char *pName;
  Abc_Obj_t *pObj;
  int fAddPos_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  iVar3 = Abc_NtkIsStrash(pNtk1);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcStrash.c"
                  ,0x146,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar3 = Abc_NtkIsLogic(pNtk2);
  if ((iVar3 == 0) && (iVar3 = Abc_NtkIsStrash(pNtk2), iVar3 == 0)) {
    __assert_fail("Abc_NtkIsLogic(pNtk2) || Abc_NtkIsStrash(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcStrash.c"
                  ,0x147,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar3 = Abc_NtkIsLogic(pNtk2);
  if ((iVar3 == 0) || (iVar3 = Abc_NtkToAig(pNtk2), iVar3 != 0)) {
    iVar3 = Abc_NtkCompareSignals(pNtk1,pNtk2,1,1);
    if (iVar3 == 0) {
      printf("Abc_NtkAppend(): The union of the network PIs is computed (warning).\n");
    }
    pObjOld._0_4_ = 0;
    Abc_NtkCleanCopy(pNtk2);
    iVar3 = Abc_NtkIsStrash(pNtk2);
    if (iVar3 != 0) {
      pAVar4 = Abc_AigConst1(pNtk1);
      pAVar5 = Abc_AigConst1(pNtk2);
      (pAVar5->field_6).pCopy = pAVar4;
    }
    for (pObjOld._4_4_ = 0; iVar3 = Abc_NtkCiNum(pNtk2), pObjOld._4_4_ < iVar3;
        pObjOld._4_4_ = pObjOld._4_4_ + 1) {
      pAVar4 = Abc_NtkCi(pNtk2,pObjOld._4_4_);
      Abc_ObjName(pAVar4);
      pcVar7 = Abc_ObjName(pAVar4);
      pAVar5 = Abc_NtkFindCi(pNtk1,pcVar7);
      (pAVar4->field_6).pCopy = pAVar5;
      if ((pAVar4->field_6).pTemp == (void *)0x0) {
        pAVar5 = Abc_NtkDupObj(pNtk1,pAVar4,1);
        (pAVar4->field_6).pCopy = pAVar5;
        pObjOld._0_4_ = (uint)pObjOld + 1;
      }
    }
    if ((uint)pObjOld != 0) {
      printf("Warning: Procedure Abc_NtkAppend() added %d new CIs.\n",(ulong)(uint)pObjOld);
    }
    iVar3 = Abc_NtkIsLogic(pNtk2);
    if (iVar3 == 0) {
      for (pObjOld._4_4_ = 0; iVar3 = Vec_PtrSize(pNtk2->vObjs), pObjOld._4_4_ < iVar3;
          pObjOld._4_4_ = pObjOld._4_4_ + 1) {
        pAVar4 = Abc_NtkObj(pNtk2,pObjOld._4_4_);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar4), iVar3 != 0)) {
          pMan = (Abc_Aig_t *)pNtk1->pManFunc;
          pAVar5 = Abc_ObjChild0Copy(pAVar4);
          pAVar6 = Abc_ObjChild1Copy(pAVar4);
          pAVar5 = Abc_AigAnd(pMan,pAVar5,pAVar6);
          (pAVar4->field_6).pCopy = pAVar5;
        }
      }
    }
    else {
      Abc_NtkStrashPerform(pNtk2,pNtk1,1,0);
    }
    if (fAddPos == 0) {
      for (pObjOld._4_4_ = 0; iVar3 = Abc_NtkCoNum(pNtk2), pObjOld._4_4_ < iVar3;
          pObjOld._4_4_ = pObjOld._4_4_ + 1) {
        pAVar4 = Abc_NtkCo(pNtk2,pObjOld._4_4_);
        p = pNtk1->pManName;
        pcVar7 = Abc_ObjName(pAVar4);
        iVar3 = Nm_ManFindIdByNameTwoTypes(p,pcVar7,3,4);
        if (iVar3 < 0) {
          __assert_fail("iNodeId >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcStrash.c"
                        ,0x17c,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
        }
        pAVar5 = Abc_NtkObj(pNtk1,iVar3);
        pAVar6 = Abc_ObjChild0(pAVar5);
        pAVar4 = Abc_ObjChild0Copy(pAVar4);
        pAVar4 = Abc_AigOr((Abc_Aig_t *)pNtk1->pManFunc,pAVar6,pAVar4);
        pAVar8 = Abc_ObjRegular(pAVar6);
        pAVar9 = Abc_ObjRegular(pAVar4);
        if (pAVar8 != pAVar9) {
          pAVar8 = Abc_ObjRegular(pAVar6);
          uVar1 = *(uint *)&pAVar8->field_0x14;
          pAVar8 = Abc_ObjRegular(pAVar4);
          uVar2 = *(uint *)&pAVar8->field_0x14;
          pAVar6 = Abc_ObjRegular(pAVar6);
          pAVar4 = Abc_ObjRegular(pAVar4);
          pAVar4 = Abc_ObjNotCond(pAVar4,uVar1 >> 7 & 1 ^ uVar2 >> 7 & 1);
          Abc_ObjPatchFanin(pAVar5,pAVar6,pAVar4);
        }
      }
    }
    else {
      for (pObjOld._4_4_ = 0; iVar3 = Abc_NtkPoNum(pNtk2), pObjOld._4_4_ < iVar3;
          pObjOld._4_4_ = pObjOld._4_4_ + 1) {
        pAVar5 = Abc_NtkPo(pNtk2,pObjOld._4_4_);
        Abc_NtkDupObj(pNtk1,pAVar5,0);
        pAVar4 = (pAVar5->field_6).pCopy;
        pAVar6 = Abc_ObjChild0Copy(pAVar5);
        Abc_ObjAddFanin(pAVar4,pAVar6);
        pAVar4 = (pAVar5->field_6).pCopy;
        pcVar7 = Abc_ObjName(pAVar5);
        Abc_ObjAssignName(pAVar4,pcVar7,(char *)0x0);
      }
    }
    iVar3 = Abc_NtkCheck(pNtk1);
    if (iVar3 == 0) {
      printf("Abc_NtkAppend: The network check has failed.\n");
      pNtk1_local._4_4_ = 0;
    }
    else {
      pNtk1_local._4_4_ = 1;
    }
  }
  else {
    printf("Converting to AIGs has failed.\n");
    pNtk1_local._4_4_ = 0;
  }
  return pNtk1_local._4_4_;
}

Assistant:

int Abc_NtkAppend( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fAddPos )
{
    Abc_Obj_t * pObj;
    char * pName;
    int i, nNewCis;
    // the first network should be an AIG
    assert( Abc_NtkIsStrash(pNtk1) );
    assert( Abc_NtkIsLogic(pNtk2) || Abc_NtkIsStrash(pNtk2) ); 
    if ( Abc_NtkIsLogic(pNtk2) && !Abc_NtkToAig(pNtk2) )
    {
        printf( "Converting to AIGs has failed.\n" );
        return 0;
    }
    // check that the networks have the same PIs
    // reorder PIs of pNtk2 according to pNtk1
    if ( !Abc_NtkCompareSignals( pNtk1, pNtk2, 1, 1 ) )
        printf( "Abc_NtkAppend(): The union of the network PIs is computed (warning).\n" );
    // perform strashing
    nNewCis = 0;
    Abc_NtkCleanCopy( pNtk2 );
    if ( Abc_NtkIsStrash(pNtk2) )
        Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtk1);
    Abc_NtkForEachCi( pNtk2, pObj, i )
    {
        pName = Abc_ObjName(pObj);
        pObj->pCopy = Abc_NtkFindCi(pNtk1, Abc_ObjName(pObj));
        if ( pObj->pCopy == NULL )
        {
            pObj->pCopy = Abc_NtkDupObj(pNtk1, pObj, 1);
            nNewCis++;
        }
    }
    if ( nNewCis )
        printf( "Warning: Procedure Abc_NtkAppend() added %d new CIs.\n", nNewCis );
    // add pNtk2 to pNtk1 while strashing
    if ( Abc_NtkIsLogic(pNtk2) )
        Abc_NtkStrashPerform( pNtk2, pNtk1, 1, 0 );
    else
        Abc_NtkForEachNode( pNtk2, pObj, i )
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk1->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // add the COs of the second network
    if ( fAddPos )
    {
        Abc_NtkForEachPo( pNtk2, pObj, i )
        {
            Abc_NtkDupObj( pNtk1, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
    }
    else
    {
        Abc_Obj_t * pObjOld, * pDriverOld, * pDriverNew;
        int fCompl, iNodeId;
        // OR the choices
        Abc_NtkForEachCo( pNtk2, pObj, i )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtk1->pManName, Abc_ObjName(pObj), ABC_OBJ_PO, ABC_OBJ_BI );
//            if ( iNodeId < 0 )
//                continue;
            assert( iNodeId >= 0 );
            pObjOld = Abc_NtkObj( pNtk1, iNodeId );
            // derive the new driver
            pDriverOld = Abc_ObjChild0( pObjOld );
            pDriverNew = Abc_ObjChild0Copy( pObj );
            pDriverNew = Abc_AigOr( (Abc_Aig_t *)pNtk1->pManFunc, pDriverOld, pDriverNew );
            if ( Abc_ObjRegular(pDriverOld) == Abc_ObjRegular(pDriverNew) )
                continue;
            // replace the old driver by the new driver
            fCompl = Abc_ObjRegular(pDriverOld)->fPhase ^ Abc_ObjRegular(pDriverNew)->fPhase;
            Abc_ObjPatchFanin( pObjOld, Abc_ObjRegular(pDriverOld), Abc_ObjNotCond(Abc_ObjRegular(pDriverNew), fCompl) );
        }
    }
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk1 ) )
    {
        printf( "Abc_NtkAppend: The network check has failed.\n" );
        return 0;
    }
    return 1;
}